

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  IString str;
  bool bVar1;
  size_type sVar2;
  Err *pEVar3;
  reference pNVar4;
  Function *this_00;
  pointer *this_01;
  reference this_02;
  reference __in;
  type *ptVar5;
  type *ptVar6;
  Module *pMVar7;
  Global *pGVar8;
  pointer pGVar9;
  char *in_RCX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  IString specific;
  string_view in;
  Name newName;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_stack_fffffffffffff928;
  Name local_620;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_610;
  __single_object global_1;
  type *type;
  type *name_2;
  _Self local_5e0;
  iterator __end2_1;
  iterator __begin2_1;
  InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_> *__range2_1;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_5a0;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_578;
  Name local_558;
  size_t local_548;
  char *pcStack_540;
  size_t local_538;
  char *pcStack_530;
  Function *local_520;
  Function *func;
  Name *name_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range3_1;
  Name *name;
  iterator __end3;
  iterator __begin3;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  basic_string_view<char,_std::char_traits<char>_> local_458;
  undefined1 local_448 [8];
  Result<wasm::Ok> parsed;
  Module intrinsicsModule;
  IString local_28;
  Module *local_18;
  Module *module_local;
  RemoveNonJSOpsPass *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  memset(&local_28,0,0x10);
  IString::IString(&local_28);
  specific.str._M_str = in_RCX;
  specific.str._M_len = (size_t)local_28.str._M_str;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)local_28.str._M_len,specific);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->builder);
  if (!bVar1) {
    std::make_unique<wasm::Builder,wasm::Module&>
              ((Module *)&intrinsicsModule.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
              (&this->builder,
               (unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &intrinsicsModule.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &intrinsicsModule.tagsMap._M_h._M_single_bucket);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,local_18);
  sVar2 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::size(&this->neededIntrinsics);
  if (sVar2 != 0) {
    pMVar7 = (Module *)
             ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    Module::Module(pMVar7);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_458,IntrinsicsModuleWast);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    in._M_str = (char *)&local_480;
    in._M_len = (size_t)local_458._M_str;
    WATParser::parseModule
              ((Result<wasm::Ok> *)local_448,(WATParser *)pMVar7,(Module *)local_458._M_len,in,in_R9
              );
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_480);
    pEVar3 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_448);
    if (pEVar3 != (Err *)0x0) {
      __assert_fail("!parsed.getErr()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveNonJSOps.cpp"
                    ,0x54,"void wasm::RemoveNonJSOpsPass::doWalkModule(Module *)");
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    while (sVar2 = std::
                   unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::size(&this->neededIntrinsics), sVar2 != 0) {
      __end3 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(&this->neededIntrinsics);
      name = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&this->neededIntrinsics);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wasm::Name,_true>,
                                (_Node_iterator_base<wasm::Name,_true> *)&name), bVar1) {
        pNVar4 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3);
        addNeededFunctions(this,(Module *)
                                ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                           (Name)(pNVar4->super_IString).str,
                           (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                           &__range3);
        std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3);
      }
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::clear(&this->neededIntrinsics);
      __end3_1 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                           ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            &__range3);
      name_1 = (Name *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                                 ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&__range3);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&name_1), bVar1) {
        func = (Function *)std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end3_1);
        local_538 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
        pcStack_530 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
        local_520 = Module::getFunctionOrNull
                              (local_18,(Name)(func->super_Importable).super_Named.name.
                                              super_IString.str);
        if (local_520 == (Function *)0x0) {
          local_548 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
          pcStack_540 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
          this_00 = Module::getFunction((Module *)
                                        ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                                        (Name)(func->super_Importable).super_Named.name.
                                              super_IString.str);
          pMVar7 = local_18;
          wasm::Name::Name(&local_558);
          std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::optional();
          std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::optional();
          newName.super_IString.str._M_str = (char *)&local_578;
          newName.super_IString.str._M_len = (size_t)local_558.super_IString.str._M_str;
          local_520 = wasm::ModuleUtils::copyFunction
                                ((ModuleUtils *)this_00,(Function *)pMVar7,
                                 (Module *)local_558.super_IString.str._M_len,newName,&local_5a0,
                                 in_stack_fffffffffffff928);
          std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~optional
                    (&local_5a0);
          std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~optional
                    (&local_578);
        }
        doWalkFunction(this,local_520);
        std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end3_1);
      }
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::clear
                ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    }
    this_01 = &intrinsicsModule.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      *)this_01);
    global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
             std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::end((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2);
      pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_02);
      wasm::ModuleUtils::copyGlobal(pGVar9,local_18);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2);
    }
    MemoryUtils::ensureExists(local_18);
    __end2_1 = InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::begin
                         (&this->neededImportedGlobals);
    local_5e0._M_node =
         (_List_node_base *)
         InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::end(&this->neededImportedGlobals);
    while (bVar1 = std::operator!=(&__end2_1,&local_5e0), bVar1) {
      __in = std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>::operator*(&__end2_1);
      ptVar5 = std::get<0ul,wasm::Name,wasm::Type>(__in);
      ptVar6 = std::get<1ul,wasm::Name,wasm::Type>(__in);
      pMVar7 = Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                          ).
                          super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .
                          super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                        );
      global_1._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
           (ptVar5->super_IString).str._M_len;
      pGVar8 = Module::getGlobalOrNull(pMVar7,(Name)(ptVar5->super_IString).str);
      if (pGVar8 == (Global *)0x0) {
        std::make_unique<wasm::Global>();
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_610);
        wasm::Name::operator=((Name *)pGVar9,ptVar5);
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_610);
        (pGVar9->type).id = ptVar6->id;
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_610);
        pGVar9->mutable_ = false;
        str.str._M_str = (char *)ENV._8_8_;
        str.str._M_len = ENV._0_8_;
        wasm::Name::Name(&local_620,str);
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_610);
        wasm::Name::operator=(&(pGVar9->super_Importable).module,&local_620);
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_610);
        wasm::Name::operator=(&(pGVar9->super_Importable).base,ptVar5);
        pMVar7 = local_18;
        pGVar9 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::release
                           (&local_610);
        Module::addGlobal(pMVar7,pGVar9);
        std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_610);
      }
      std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>::operator++(&__end2_1);
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_448);
    Module::~Module((Module *)
                    ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    [[maybe_unused]] auto parsed =
      WATParser::parseModule(intrinsicsModule, IntrinsicsModuleWast);
    assert(!parsed.getErr());

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }